

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegStreamReader.cpp
# Opt level: O2

int __thiscall MPEGStreamReader::bufFromNAL(MPEGStreamReader *this)

{
  uint8_t *puVar1;
  
  puVar1 = (this->super_AbstractStreamReader).m_curPos;
  if ((((long)((ulong)this->m_longCodesAllowed + 3) <=
        (long)(this->super_AbstractStreamReader).m_bufEnd - (long)puVar1) && (*puVar1 == '\0')) &&
     (puVar1[1] == '\0')) {
    if ((puVar1[2] == '\0' & this->m_longCodesAllowed) == 1) {
      if (puVar1[3] == '\x01') {
        return 4;
      }
    }
    else if (puVar1[2] == '\x01') {
      return 3;
    }
  }
  return 0;
}

Assistant:

int MPEGStreamReader::bufFromNAL() const
{
    if (m_bufEnd - m_curPos < (3 + (m_longCodesAllowed ? 1 : 0)))
        return 0;
    if (m_curPos[0] == 0 && m_curPos[1] == 0)
    {
        if (m_longCodesAllowed && m_curPos[2] == 0 && m_curPos[3] == 1)
            return 4;
        if (m_curPos[2] == 1)
            return 3;
    }
    return 0;
}